

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-memory.c
# Opt level: O1

int run_test_get_memory(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  char **ppcVar3;
  char **ppcVar4;
  undefined8 uVar5;
  size_t sVar6;
  uv_getaddrinfo_t *puVar7;
  undefined4 *puVar8;
  int *piVar9;
  long extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long extraout_RDX_02;
  size_t *psVar10;
  undefined8 *puVar11;
  int *piVar12;
  long lVar13;
  undefined1 auStack_260 [144];
  undefined8 uStack_1d0;
  char **ppcStack_1c0;
  char **ppcStack_1b8;
  char **ppcStack_1b0;
  undefined1 auStack_1a8 [144];
  undefined8 uStack_118;
  char **ppcStack_108;
  code *pcStack_100;
  undefined1 auStack_f8 [160];
  char **ppcStack_58;
  char *pcStack_48;
  long lStack_40;
  long lStack_38;
  char *pcStack_30;
  char **ppcStack_28;
  char **ppcStack_20;
  
  ppcStack_20 = (char **)0x15b4d1;
  ppcVar3 = (char **)uv_get_free_memory();
  ppcStack_20 = (char **)0x15b4d9;
  ppcVar4 = (char **)uv_get_total_memory();
  ppcStack_20 = (char **)0x15b4e1;
  uVar5 = uv_get_constrained_memory();
  ppcStack_20 = (char **)0x15b4f8;
  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu\n",ppcVar3,ppcVar4,uVar5);
  if (ppcVar3 == (char **)0x0) {
    ppcStack_20 = (char **)0x15b516;
    run_test_get_memory_cold_3();
LAB_0015b516:
    ppcStack_20 = (char **)0x15b51b;
    run_test_get_memory_cold_2();
  }
  else {
    if (ppcVar4 == (char **)0x0) goto LAB_0015b516;
    if (ppcVar3 < ppcVar4) {
      return 0;
    }
  }
  ppcStack_20 = (char **)run_test_get_passwd;
  run_test_get_memory_cold_1();
  ppcStack_58 = (char **)0x15b52f;
  ppcStack_20 = ppcVar3;
  iVar1 = uv_os_get_passwd(&pcStack_48);
  ppcVar4 = ppcStack_28;
  if (iVar1 == 0) {
    if (*pcStack_48 == '\0') goto LAB_0015b5f3;
    if (*pcStack_30 == '\0') goto LAB_0015b5f8;
    ppcStack_58 = (char **)0x15b560;
    sVar6 = strlen((char *)ppcStack_28);
    ppcVar3 = ppcVar4;
    if (sVar6 != 1) {
      if (sVar6 != 0) {
        if (*(char *)((long)ppcVar4 + (sVar6 - 1)) == '/') {
          ppcStack_58 = (char **)0x15b57b;
          run_test_get_passwd_cold_13();
          goto LAB_0015b57b;
        }
        goto LAB_0015b584;
      }
      goto LAB_0015b62a;
    }
LAB_0015b57b:
    if (*(char *)ppcVar4 == '/') {
LAB_0015b584:
      if (lStack_40 < 0) goto LAB_0015b5fd;
      if (lStack_38 < 0) goto LAB_0015b602;
      ppcVar3 = &pcStack_48;
      ppcStack_58 = (char **)0x15b5a1;
      uv_os_free_passwd(ppcVar3);
      if (pcStack_48 != (char *)0x0) goto LAB_0015b607;
      if (pcStack_30 != (char *)0x0) goto LAB_0015b60c;
      if (ppcStack_28 != (char **)0x0) goto LAB_0015b611;
      ppcVar3 = &pcStack_48;
      ppcStack_58 = (char **)0x15b5c4;
      uv_os_free_passwd(ppcVar3);
      if (pcStack_48 != (char *)0x0) goto LAB_0015b616;
      if (pcStack_30 != (char *)0x0) goto LAB_0015b61b;
      if (ppcStack_28 != (char **)0x0) goto LAB_0015b620;
      ppcStack_58 = (char **)0x15b5e1;
      iVar1 = uv_os_get_passwd(0);
      if (iVar1 == -0x16) {
        return 0;
      }
      goto LAB_0015b625;
    }
  }
  else {
    ppcStack_58 = (char **)0x15b5f3;
    run_test_get_passwd_cold_1();
LAB_0015b5f3:
    ppcStack_58 = (char **)0x15b5f8;
    run_test_get_passwd_cold_15();
LAB_0015b5f8:
    ppcStack_58 = (char **)0x15b5fd;
    run_test_get_passwd_cold_14();
LAB_0015b5fd:
    ppcStack_58 = (char **)0x15b602;
    run_test_get_passwd_cold_4();
LAB_0015b602:
    ppcStack_58 = (char **)0x15b607;
    run_test_get_passwd_cold_5();
LAB_0015b607:
    ppcStack_58 = (char **)0x15b60c;
    run_test_get_passwd_cold_6();
LAB_0015b60c:
    ppcStack_58 = (char **)0x15b611;
    run_test_get_passwd_cold_7();
LAB_0015b611:
    ppcStack_58 = (char **)0x15b616;
    run_test_get_passwd_cold_8();
LAB_0015b616:
    ppcStack_58 = (char **)0x15b61b;
    run_test_get_passwd_cold_9();
LAB_0015b61b:
    ppcStack_58 = (char **)0x15b620;
    run_test_get_passwd_cold_10();
LAB_0015b620:
    ppcStack_58 = (char **)0x15b625;
    run_test_get_passwd_cold_11();
LAB_0015b625:
    ppcStack_58 = (char **)0x15b62a;
    run_test_get_passwd_cold_12();
LAB_0015b62a:
    ppcStack_58 = (char **)0x15b62f;
    run_test_get_passwd_cold_3();
  }
  ppcStack_58 = (char **)run_test_getaddrinfo_fail;
  run_test_get_passwd_cold_2();
  iVar1 = (int)auStack_f8;
  pcStack_100 = (code *)0x15b641;
  ppcStack_58 = ppcVar3;
  uVar5 = uv_default_loop();
  pcStack_100 = (code *)0x15b65b;
  iVar2 = uv_getaddrinfo(uVar5,auStack_f8,abort,0,0,0);
  if (iVar2 == -0x16) {
    pcStack_100 = (code *)0x15b669;
    uVar5 = uv_default_loop();
    pcStack_100 = (code *)0x15b688;
    iVar1 = (int)auStack_f8;
    iVar2 = uv_getaddrinfo(uVar5,auStack_f8,getaddrinfo_fail_cb,"xyzzy.xyzzy.xyzzy.",0,0);
    if (iVar2 != 0) goto LAB_0015b6ec;
    pcStack_100 = (code *)0x15b691;
    uVar5 = uv_default_loop();
    iVar1 = 0;
    pcStack_100 = (code *)0x15b69b;
    iVar2 = uv_run(uVar5);
    if (iVar2 != 0) goto LAB_0015b6f1;
    if (fail_cb_called != 1) goto LAB_0015b6f6;
    pcStack_100 = (code *)0x15b6ad;
    ppcVar3 = (char **)uv_default_loop();
    pcStack_100 = (code *)0x15b6c1;
    uv_walk(ppcVar3,close_walk_cb,0);
    iVar1 = 0;
    pcStack_100 = (code *)0x15b6cb;
    uv_run(ppcVar3);
    pcStack_100 = (code *)0x15b6d0;
    uVar5 = uv_default_loop();
    pcStack_100 = (code *)0x15b6d8;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_100 = (code *)0x15b6ec;
    run_test_getaddrinfo_fail_cold_1();
LAB_0015b6ec:
    pcStack_100 = (code *)0x15b6f1;
    run_test_getaddrinfo_fail_cold_2();
LAB_0015b6f1:
    pcStack_100 = (code *)0x15b6f6;
    run_test_getaddrinfo_fail_cold_3();
LAB_0015b6f6:
    pcStack_100 = (code *)0x15b6fb;
    run_test_getaddrinfo_fail_cold_4();
  }
  pcStack_100 = getaddrinfo_fail_cb;
  run_test_getaddrinfo_fail_cold_5();
  if (fail_cb_called == 0) {
    if (-1 < iVar1) goto LAB_0015b727;
    if (extraout_RDX == 0) {
      ppcStack_108 = (char **)0x15b71a;
      pcStack_100._0_4_ = extraout_EAX;
      uv_freeaddrinfo(0);
      fail_cb_called = fail_cb_called + 1;
      return (int)pcStack_100;
    }
  }
  else {
    ppcStack_108 = (char **)0x15b727;
    getaddrinfo_fail_cb_cold_1();
LAB_0015b727:
    ppcStack_108 = (char **)0x15b72c;
    getaddrinfo_fail_cb_cold_2();
  }
  ppcStack_108 = (char **)run_test_getaddrinfo_fail_sync;
  getaddrinfo_fail_cb_cold_3();
  ppcStack_1b0 = (char **)0x15b73e;
  ppcStack_108 = ppcVar3;
  uVar5 = uv_default_loop();
  ppcStack_1b0 = (char **)0x15b758;
  iVar1 = uv_getaddrinfo(uVar5,auStack_1a8,0,"xyzzy.xyzzy.xyzzy.",0,0);
  if (iVar1 < 0) {
    ppcStack_1b0 = (char **)0x15b769;
    uv_freeaddrinfo(uStack_118);
    ppcStack_1b0 = (char **)0x15b76e;
    ppcVar3 = (char **)uv_default_loop();
    ppcStack_1b0 = (char **)0x15b782;
    uv_walk(ppcVar3,close_walk_cb,0);
    ppcStack_1b0 = (char **)0x15b78c;
    uv_run(ppcVar3,0);
    ppcStack_1b0 = (char **)0x15b791;
    uVar5 = uv_default_loop();
    ppcStack_1b0 = (char **)0x15b799;
    iVar1 = uv_loop_close(uVar5);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    ppcStack_1b0 = (char **)0x15b7ad;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  ppcStack_1b0 = (char **)run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  ppcStack_1b8 = (char **)0x15b7bd;
  ppcStack_1b0 = ppcVar3;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  ppcStack_1b8 = (char **)0x15b7c9;
  puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
  ppcStack_1b8 = (char **)0x15b7ec;
  iVar1 = uv_getaddrinfo(puVar7,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",0,0);
  if (iVar1 == 0) {
    ppcStack_1b8 = (char **)0x15b7f5;
    puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
    ppcStack_1b8 = (char **)0x15b7ff;
    uv_run(puVar7,0);
    if (getaddrinfo_cbs != 1) goto LAB_0015b845;
    ppcStack_1b8 = (char **)0x15b80d;
    ppcVar3 = (char **)uv_default_loop();
    ppcStack_1b8 = (char **)0x15b821;
    uv_walk(ppcVar3,close_walk_cb,0);
    ppcStack_1b8 = (char **)0x15b82b;
    uv_run(ppcVar3,0);
    ppcStack_1b8 = (char **)0x15b830;
    puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
    ppcStack_1b8 = (char **)0x15b838;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    ppcStack_1b8 = (char **)0x15b845;
    run_test_getaddrinfo_basic_cold_1();
LAB_0015b845:
    ppcStack_1b8 = (char **)0x15b84a;
    run_test_getaddrinfo_basic_cold_2();
  }
  ppcStack_1b8 = (char **)getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  ppcStack_1b8 = ppcVar3;
  if (getaddrinfo_handle == puVar7) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    ppcStack_1c0 = (char **)0x15b867;
    free(puVar7);
    iVar1 = uv_freeaddrinfo(extraout_RDX_00);
    return iVar1;
  }
  ppcStack_1c0 = (char **)run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  ppcStack_1c0 = ppcVar3;
  uVar5 = uv_default_loop();
  iVar1 = uv_getaddrinfo(uVar5,auStack_260,0,"localhost",0,0);
  if (iVar1 == 0) {
    uv_freeaddrinfo(uStack_1d0);
    ppcVar3 = (char **)uv_default_loop();
    uv_walk(ppcVar3,close_walk_cb,0);
    uv_run(ppcVar3,0);
    uVar5 = uv_default_loop();
    iVar1 = uv_loop_close(uVar5);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  puVar7 = getaddrinfo_handles;
  piVar12 = callback_counts;
  lVar13 = 0;
  do {
    *piVar12 = 0;
    puVar11 = (undefined8 *)0x4;
    puVar8 = (undefined4 *)malloc(4);
    if (puVar8 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015b9e4:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_0015b9e9;
    }
    *puVar8 = (int)lVar13;
    puVar7->data = puVar8;
    puVar11 = (undefined8 *)uv_default_loop();
    iVar1 = uv_getaddrinfo(puVar11,puVar7,getaddrinfo_cuncurrent_cb,"localhost",0,0,ppcVar3);
    if (iVar1 != 0) goto LAB_0015b9e4;
    lVar13 = lVar13 + 1;
    puVar7 = puVar7 + 1;
    piVar12 = piVar12 + 1;
  } while (lVar13 != 10);
  puVar11 = (undefined8 *)uv_default_loop();
  lVar13 = 0;
  uv_run(puVar11,0);
  do {
    if (*(int *)((long)callback_counts + lVar13) != 1) goto LAB_0015b9e9;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0x28);
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  puVar11 = (undefined8 *)uv_default_loop();
  iVar1 = uv_loop_close();
  if (iVar1 == 0) {
    return 0;
  }
LAB_0015b9ee:
  run_test_getaddrinfo_concurrent_cold_3();
  piVar12 = (int *)*puVar11;
  piVar9 = callback_counts;
  psVar10 = &closedir_req.bufsml[1].len;
  lVar13 = 0;
  do {
    psVar10 = psVar10 + 0x14;
    if (psVar10 == puVar11) goto LAB_0015ba2b;
    piVar9 = piVar9 + 1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar13 = extraout_RDX_02;
LAB_0015ba2b:
  if (*piVar12 == (int)lVar13) {
    *piVar9 = *piVar9 + 1;
    free(piVar12);
    iVar1 = uv_freeaddrinfo(extraout_RDX_01);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return iVar1;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(piVar12,0);
  return iVar1;
LAB_0015b9e9:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0015b9ee;
}

Assistant:

TEST_IMPL(get_memory) {
  uint64_t free_mem = uv_get_free_memory();
  uint64_t total_mem = uv_get_total_memory();
  uint64_t constrained_mem = uv_get_constrained_memory();

  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu\n",
         (unsigned long long) free_mem,
         (unsigned long long) total_mem,
         (unsigned long long) constrained_mem);

  /* On IBMi PASE, the amount of memory in use includes storage used for
   * memory and disks so it is possible to exceed the amount of main storage.
   */
#ifndef __PASE__
  ASSERT(free_mem > 0);
#endif
  ASSERT(total_mem > 0);
  ASSERT(total_mem > free_mem);

  return 0;
}